

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

sqlite3_value * valueNew(sqlite3 *db,ValueNewStat4Ctx *p)

{
  Index *pIdx_00;
  uint uVar1;
  KeyInfo *pKVar2;
  int local_38;
  int nCol;
  int i;
  int nByte;
  Index *pIdx;
  UnpackedRecord *pRec;
  ValueNewStat4Ctx *p_local;
  sqlite3 *db_local;
  
  if (p == (ValueNewStat4Ctx *)0x0) {
    db_local = (sqlite3 *)sqlite3ValueNew(db);
  }
  else {
    pIdx = (Index *)*p->ppRec;
    if (pIdx == (Index *)0x0) {
      pIdx_00 = p->pIdx;
      uVar1 = (uint)pIdx_00->nColumn;
      pIdx = (Index *)sqlite3DbMallocZero(db,(long)(int)(uVar1 * 0x38 + 0x18));
      if (pIdx != (Index *)0x0) {
        pKVar2 = sqlite3KeyInfoOfIndex(p->pParse,pIdx_00);
        pIdx->zName = (char *)pKVar2;
        if (pIdx->zName == (char *)0x0) {
          sqlite3DbFreeNN(db,pIdx);
          pIdx = (Index *)0x0;
        }
        else {
          pIdx->aiColumn = (i16 *)&pIdx->pTable;
          for (local_38 = 0; local_38 < (int)uVar1; local_38 = local_38 + 1) {
            pIdx->aiColumn[(long)local_38 * 0x1c + 4] = 1;
            *(sqlite3 **)(pIdx->aiColumn + (long)local_38 * 0x1c + 0x14) = db;
          }
        }
      }
      if (pIdx == (Index *)0x0) {
        return (sqlite3_value *)0x0;
      }
      *p->ppRec = (UnpackedRecord *)pIdx;
    }
    *(short *)&pIdx->aiRowLogEst = (short)p->iVal + 1;
    db_local = (sqlite3 *)(pIdx->aiColumn + (long)p->iVal * 0x1c);
  }
  return (sqlite3_value *)db_local;
}

Assistant:

static sqlite3_value *valueNew(sqlite3 *db, struct ValueNewStat4Ctx *p){
#ifdef SQLITE_ENABLE_STAT3_OR_STAT4
  if( p ){
    UnpackedRecord *pRec = p->ppRec[0];

    if( pRec==0 ){
      Index *pIdx = p->pIdx;      /* Index being probed */
      int nByte;                  /* Bytes of space to allocate */
      int i;                      /* Counter variable */
      int nCol = pIdx->nColumn;   /* Number of index columns including rowid */
  
      nByte = sizeof(Mem) * nCol + ROUND8(sizeof(UnpackedRecord));
      pRec = (UnpackedRecord*)sqlite3DbMallocZero(db, nByte);
      if( pRec ){
        pRec->pKeyInfo = sqlite3KeyInfoOfIndex(p->pParse, pIdx);
        if( pRec->pKeyInfo ){
          assert( pRec->pKeyInfo->nAllField==nCol );
          assert( pRec->pKeyInfo->enc==ENC(db) );
          pRec->aMem = (Mem *)((u8*)pRec + ROUND8(sizeof(UnpackedRecord)));
          for(i=0; i<nCol; i++){
            pRec->aMem[i].flags = MEM_Null;
            pRec->aMem[i].db = db;
          }
        }else{
          sqlite3DbFreeNN(db, pRec);
          pRec = 0;
        }
      }
      if( pRec==0 ) return 0;
      p->ppRec[0] = pRec;
    }
  
    pRec->nField = p->iVal+1;
    return &pRec->aMem[p->iVal];
  }
#else
  UNUSED_PARAMETER(p);
#endif /* defined(SQLITE_ENABLE_STAT3_OR_STAT4) */
  return sqlite3ValueNew(db);
}